

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLDriver.cpp
# Opt level: O0

void __thiscall
irr::video::COpenGLDriver::enableClipPlane(COpenGLDriver *this,u32 index,bool enable)

{
  byte bVar1;
  SUserClipPlane *pSVar2;
  byte in_DL;
  uint in_ESI;
  long in_RDI;
  u32 in_stack_0000000c;
  COpenGLDriver *in_stack_00000010;
  u32 in_stack_ffffffffffffffdc;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  
  bVar1 = in_DL & 1;
  if (in_ESI < *(byte *)(in_RDI + 0x49c)) {
    if (bVar1 == 0) {
      glDisable(in_ESI + 0x3000);
    }
    else {
      pSVar2 = core::array<irr::video::COpenGLDriver::SUserClipPlane>::operator[]
                         ((array<irr::video::COpenGLDriver::SUserClipPlane> *)
                          CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0),
                          in_stack_ffffffffffffffdc);
      if ((pSVar2->Enabled & 1U) == 0) {
        uploadClipPlane(in_stack_00000010,in_stack_0000000c);
        glEnable(in_ESI + 0x3000);
      }
    }
    pSVar2 = core::array<irr::video::COpenGLDriver::SUserClipPlane>::operator[]
                       ((array<irr::video::COpenGLDriver::SUserClipPlane> *)
                        (CONCAT17(in_DL,in_stack_ffffffffffffffe0) & 0x1ffffffffffffff),
                        in_stack_ffffffffffffffdc);
    pSVar2->Enabled = (bool)(bVar1 & 1);
  }
  return;
}

Assistant:

void COpenGLDriver::enableClipPlane(u32 index, bool enable)
{
	if (index >= MaxUserClipPlanes)
		return;
	if (enable) {
		if (!UserClipPlanes[index].Enabled) {
			uploadClipPlane(index);
			glEnable(GL_CLIP_PLANE0 + index);
		}
	} else
		glDisable(GL_CLIP_PLANE0 + index);

	UserClipPlanes[index].Enabled = enable;
}